

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O3

float Nwk_NodePropagateRequired(Nwk_Obj_t *pObj,int fUseSorting)

{
  float (*pafVar1) [33];
  int iVar2;
  If_LibLut_t *pIVar3;
  Nwk_Obj_t **ppNVar4;
  long lVar5;
  Nwk_Obj_t *pNVar6;
  long lVar7;
  float fVar8;
  int pPinPerm [32];
  float pPinDelays [32];
  int local_118 [32];
  float local_98 [34];
  
  if ((*(uint *)&pObj->field_0x20 & 7) != 3) {
    __assert_fail("Nwk_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                  ,0x111,"float Nwk_NodePropagateRequired(Nwk_Obj_t *, int)");
  }
  pIVar3 = pObj->pMan->pLutLib;
  if (pIVar3 == (If_LibLut_t *)0x0) {
    fVar8 = pObj->tRequired + -1.0;
    iVar2 = pObj->nFanins;
    if (0 < (long)iVar2) {
      ppNVar4 = pObj->pFanio;
      lVar5 = 0;
      do {
        pNVar6 = ppNVar4[lVar5];
        if (pNVar6 == (Nwk_Obj_t *)0x0) {
          return fVar8;
        }
        if (fVar8 < pNVar6->tRequired) {
          pNVar6->tRequired = fVar8;
        }
        lVar5 = lVar5 + 1;
      } while (iVar2 != lVar5);
    }
  }
  else {
    iVar2 = pObj->nFanins;
    lVar5 = (long)iVar2;
    pafVar1 = pIVar3->pLutDelays + lVar5;
    if (pIVar3->fVarPinDelays == 0) {
      fVar8 = pObj->tRequired - (*pafVar1)[0];
      if (0 < iVar2) {
        ppNVar4 = pObj->pFanio;
        lVar7 = 0;
        do {
          pNVar6 = ppNVar4[lVar7];
          if (pNVar6 == (Nwk_Obj_t *)0x0) {
            return fVar8;
          }
          if (fVar8 < pNVar6->tRequired) {
            pNVar6->tRequired = fVar8;
          }
          lVar7 = lVar7 + 1;
        } while (lVar5 != lVar7);
      }
    }
    else if (fUseSorting == 0) {
      fVar8 = 0.0;
      if (0 < iVar2) {
        ppNVar4 = pObj->pFanio;
        pNVar6 = *ppNVar4;
        if (pNVar6 != (Nwk_Obj_t *)0x0) {
          lVar7 = 0;
          do {
            fVar8 = pObj->tRequired - (*pafVar1)[lVar7];
            if (fVar8 < pNVar6->tRequired) {
              pNVar6->tRequired = fVar8;
            }
            if (lVar5 + -1 == lVar7) {
              return fVar8;
            }
            pNVar6 = ppNVar4[lVar7 + 1];
            lVar7 = lVar7 + 1;
          } while (pNVar6 != (Nwk_Obj_t *)0x0);
        }
      }
    }
    else {
      Nwk_ManDelayTraceSortPins(pObj,local_118,local_98);
      iVar2 = pObj->nFanins;
      fVar8 = 0.0;
      if ((0 < (long)iVar2) && (ppNVar4 = pObj->pFanio, *ppNVar4 != (Nwk_Obj_t *)0x0)) {
        lVar5 = 0;
        do {
          fVar8 = pObj->tRequired - (*pafVar1)[lVar5];
          if (fVar8 < ppNVar4[local_118[lVar5]]->tRequired) {
            ppNVar4[local_118[lVar5]]->tRequired = fVar8;
          }
        } while (((long)iVar2 + -1 != lVar5) &&
                (lVar7 = lVar5 + 1, lVar5 = lVar5 + 1, ppNVar4[lVar7] != (Nwk_Obj_t *)0x0));
      }
    }
  }
  return fVar8;
}

Assistant:

float Nwk_NodePropagateRequired( Nwk_Obj_t * pObj, int fUseSorting )
{
    If_LibLut_t * pLutLib = pObj->pMan->pLutLib;
    int pPinPerm[32];
    float pPinDelays[32];
    Nwk_Obj_t * pFanin;
    float tRequired = 0.0; // Suppress "might be used uninitialized"
    float * pDelays;
    int k;
    assert( Nwk_ObjIsNode(pObj) );
    if ( pLutLib == NULL )
    {
        tRequired = Nwk_ObjRequired(pObj) - (float)1.0;
        Nwk_ObjForEachFanin( pObj, pFanin, k )
            if ( Nwk_ObjRequired(pFanin) > tRequired )
                Nwk_ObjSetRequired( pFanin, tRequired );
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Nwk_ObjFaninNum(pObj)];
        tRequired = Nwk_ObjRequired(pObj) - pDelays[0];
        Nwk_ObjForEachFanin( pObj, pFanin, k )
            if ( Nwk_ObjRequired(pFanin) > tRequired )
                Nwk_ObjSetRequired( pFanin, tRequired );
    }
    else 
    {
        pDelays = pLutLib->pLutDelays[Nwk_ObjFaninNum(pObj)];
        if ( fUseSorting )
        {
            Nwk_ManDelayTraceSortPins( pObj, pPinPerm, pPinDelays );
            Nwk_ObjForEachFanin( pObj, pFanin, k )
            {
                tRequired = Nwk_ObjRequired(pObj) - pDelays[k];
                if ( Nwk_ObjRequired(Nwk_ObjFanin(pObj,pPinPerm[k])) > tRequired )
                    Nwk_ObjSetRequired( Nwk_ObjFanin(pObj,pPinPerm[k]), tRequired );
            }
        }
        else
        {
            Nwk_ObjForEachFanin( pObj, pFanin, k )
            {
                tRequired = Nwk_ObjRequired(pObj) - pDelays[k];
                if ( Nwk_ObjRequired(pFanin) > tRequired )
                    Nwk_ObjSetRequired( pFanin, tRequired );
            }
        }
    }
    return tRequired;
}